

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O3

void __thiscall
wasm::Localizer::Localizer(Localizer *this,Expression *input,Function *func,Module *wasm)

{
  Expression *pEVar1;
  Type type_;
  undefined1 auVar2 [16];
  Index IVar3;
  LocalSet *this_00;
  Type in_R8;
  
  this->expr = input;
  if ((input->_id == LocalSetId) || (input->_id == LocalGetId)) {
    this->index = input[1]._id;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (input->type).id;
    IVar3 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    this->index = IVar3;
    pEVar1 = this->expr;
    type_.id = (pEVar1->type).id;
    this_00 = (LocalSet *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar3;
    this_00->value = pEVar1;
    LocalSet::makeTee(this_00,type_);
    this->expr = (Expression *)this_00;
  }
  return;
}

Assistant:

Localizer(Expression* input, Function* func, Module* wasm) {
    expr = input;
    if (auto* get = expr->dynCast<LocalGet>()) {
      index = get->index;
    } else if (auto* set = expr->dynCast<LocalSet>()) {
      index = set->index;
    } else {
      index = Builder::addVar(func, expr->type);
      expr = Builder(*wasm).makeLocalTee(index, expr, expr->type);
    }
  }